

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.cpp
# Opt level: O2

void * gpControlThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  int local_cc8;
  CHRONO chrono_period;
  char szTemp [256];
  char szSaveFilePath [256];
  GPCONTROL gpcontrol;
  
  memset(&gpcontrol,0,0xa48);
  StartChrono(&chrono_period);
  iVar9 = 100;
  bVar2 = false;
  local_cc8 = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)iVar9);
      if (bPausegpControl == 0) break;
      if (!bVar2) {
        puts("gpControl Paused.");
        DisconnectgpControl(&gpcontrol);
      }
      if (bExit != 0) goto LAB_00147294;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartgpControl == 0) {
      if (bVar2) goto LAB_001470cc;
      iVar6 = KeepAlivegpControl(&gpcontrol);
      if (iVar6 != 0) {
        puts("Connection to a gpControl lost.");
        DisconnectgpControl(&gpcontrol);
        goto LAB_001470e9;
      }
      bVar3 = false;
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a gpControl.");
        DisconnectgpControl(&gpcontrol);
      }
      bRestartgpControl = 0;
LAB_001470cc:
      iVar5 = ConnectgpControl(&gpcontrol,"gpControl0.txt");
      iVar6 = gpcontrol.threadperiod;
      if (iVar5 == 0) {
        if (gpcontrol.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)gpcontrol.pfSaveFile);
          gpcontrol.pfSaveFile = (FILE *)0x0;
        }
        if (gpcontrol.bSaveRawData != 0) {
          if (gpcontrol.szCfgFilePath[0] == '\0') {
            builtin_strncpy(szTemp,"gpcontrol",10);
          }
          else {
            sprintf(szTemp,"%.127s",gpcontrol.szCfgFilePath);
          }
          sVar7 = strlen(szTemp);
          iVar9 = (int)sVar7 + 1;
          uVar10 = sVar7 & 0xffffffff;
          do {
            if ((int)uVar10 < 1) goto LAB_001471ef;
            uVar1 = uVar10 - 1;
            iVar9 = iVar9 + -1;
            lVar4 = uVar10 - 1;
            uVar10 = uVar1;
          } while (szTemp[lVar4] != '.');
          if ((uVar1 != 0) && (iVar9 <= (int)sVar7)) {
            memset(szTemp + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
          }
LAB_001471ef:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar8 = strtimeex_fns();
          sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar8);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          gpcontrol.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
          if ((FILE *)gpcontrol.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create gpControl data file.");
            bVar3 = false;
            goto LAB_00147297;
          }
          fwrite("tv_sec;tv_usec;val;\n",0x14,1,(FILE *)gpcontrol.pfSaveFile);
          fflush((FILE *)gpcontrol.pfSaveFile);
        }
        bVar3 = false;
        bVar2 = true;
        iVar9 = iVar6;
      }
      else {
        mSleep(1000);
LAB_001470e9:
        local_cc8 = local_cc8 + 1;
        if (ExitOnErrorCount <= local_cc8 && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_00147294:
          bVar3 = true;
          goto LAB_00147297;
        }
        bVar2 = false;
        bVar3 = true;
      }
    }
    if (bExit != 0) {
LAB_00147297:
      StopChronoQuick(&chrono_period);
      if (gpcontrol.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)gpcontrol.pfSaveFile);
        gpcontrol.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectgpControl(&gpcontrol);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE gpControlThread(void* pParam)
{
	GPCONTROL gpcontrol;
	//struct timeval tv;
	//double val = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&gpcontrol, 0, sizeof(GPCONTROL));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPausegpControl)
		{
			if (bConnected)
			{
				printf("gpControl Paused.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartgpControl)
		{
			if (bConnected)
			{
				printf("Restarting a gpControl.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			bRestartgpControl = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectgpControl(&gpcontrol, "gpControl0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = gpcontrol.threadperiod;

				if (gpcontrol.pfSaveFile != NULL)
				{
					fclose(gpcontrol.pfSaveFile); 
					gpcontrol.pfSaveFile = NULL;
				}
				if ((gpcontrol.bSaveRawData)&&(gpcontrol.pfSaveFile == NULL)) 
				{
					if (strlen(gpcontrol.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", gpcontrol.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "gpcontrol");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					gpcontrol.pfSaveFile = fopen(szSaveFilePath, "w");
					if (gpcontrol.pfSaveFile == NULL) 
					{
						printf("Unable to create gpControl data file.\n");
						break;
					}
					fprintf(gpcontrol.pfSaveFile, "tv_sec;tv_usec;val;\n"); 
					fflush(gpcontrol.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (KeepAlivegpControl(&gpcontrol) == EXIT_SUCCESS)
			{
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				//EnterCriticalSection(&StateVariablesCS);


				//LeaveCriticalSection(&StateVariablesCS);

				//if (gpcontrol.bSaveRawData)
				//{
				//	fprintf(gpcontrol.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, val);
				//	fflush(gpcontrol.pfSaveFile);
				//}
			}
			else
			{
				printf("Connection to a gpControl lost.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}		
		}

		//printf("gpControlThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (gpcontrol.pfSaveFile != NULL)
	{
		fclose(gpcontrol.pfSaveFile); 
		gpcontrol.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectgpControl(&gpcontrol);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}